

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_7::Validator::CheckDataSegments(Validator *this,Module *module)

{
  bool bVar1;
  Result result;
  Memory *local_70;
  Memory *memory;
  DataSegment *data_segment;
  DataSegmentModuleField *data_segment_field;
  ModuleField *field;
  intrusive_list<wabt::ModuleField> *local_48;
  undefined1 local_40 [8];
  const_iterator __end2;
  const_iterator __begin2;
  ModuleFieldList *__range2;
  Module *module_local;
  Validator *this_local;
  
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&module->fields);
  _local_40 = intrusive_list<wabt::ModuleField>::end(&module->fields);
  while( true ) {
    field = (ModuleField *)local_40;
    local_48 = __end2.list_;
    bVar1 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)&__end2.node_,_local_40);
    if (!bVar1) break;
    data_segment_field =
         (DataSegmentModuleField *)
         intrusive_list<wabt::ModuleField>::const_iterator::operator*
                   ((const_iterator *)&__end2.node_);
    data_segment = (DataSegment *)
                   dyn_cast<wabt::DataSegmentModuleField,wabt::ModuleField>
                             ((ModuleField *)data_segment_field);
    if (((DataSegmentModuleField *)data_segment != (DataSegmentModuleField *)0x0) &&
       (memory = (Memory *)&((DataSegmentModuleField *)data_segment)->data_segment,
       ((((DataSegmentModuleField *)data_segment)->data_segment).passive & 1U) == 0)) {
      result = CheckMemoryVar(this,&(((DataSegmentModuleField *)data_segment)->data_segment).
                                    memory_var,&local_70);
      bVar1 = Failed(result);
      if (!bVar1) {
        CheckConstInitExpr(this,&(data_segment_field->
                                 super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField
                                 .loc,(ExprList *)(memory + 2),I32,"data segment offset");
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2.node_);
  }
  return;
}

Assistant:

void Validator::CheckDataSegments(const Module* module) {
  for (const ModuleField& field : module->fields) {
    if (auto data_segment_field = dyn_cast<DataSegmentModuleField>(&field)) {
      auto&& data_segment = data_segment_field->data_segment;
      const Memory* memory;
      if (data_segment.passive)  {
        continue;
      }
      if (Failed(CheckMemoryVar(&data_segment.memory_var, &memory))) {
        continue;
      }
      CheckConstInitExpr(&field.loc, data_segment.offset, Type::I32,
                         "data segment offset");
    }
  }
}